

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.cpp
# Opt level: O0

void check_alt(char *arg_val_str,rtosc_print_options *opt,char *tc_base,int line,char *_exp_print)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char *in_RDX;
  rtosc_print_options *in_RSI;
  char *in_RDI;
  char *in_R8;
  char *exp_print;
  size_t written;
  char *printed;
  size_t len;
  size_t rd;
  int num;
  char strbuf [256];
  int strbuflen;
  char tc_full [256];
  int tc_len;
  undefined4 in_stack_fffffffffffffd58;
  int in_stack_fffffffffffffd5c;
  char *in_stack_fffffffffffffd60;
  char *__dest;
  char *in_stack_fffffffffffffd70;
  char *local_288;
  size_t in_stack_fffffffffffffd90;
  char *in_stack_fffffffffffffd98;
  size_t in_stack_fffffffffffffda0;
  size_t __n;
  rtosc_arg_val_t *in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdb0;
  undefined1 local_248 [268];
  undefined4 local_13c;
  char local_138 [268];
  undefined4 local_2c;
  char *local_28;
  char *local_18;
  rtosc_print_options *local_10;
  char *local_8;
  
  local_2c = 0x100;
  local_13c = 0x100;
  local_28 = in_R8;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(local_248,0x7f,0x100);
  iVar1 = rtosc_count_printed_arg_vals(in_stack_fffffffffffffd70);
  rtosc_scan_arg_vals((char *)CONCAT44(iVar1,in_stack_fffffffffffffdb0),in_stack_fffffffffffffda8,
                      in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90)
  ;
  strcpy(local_138,"scan \"");
  strncat(local_138,local_18,0xf9);
  sVar2 = strlen(local_138);
  strncat(local_138,"\" (read exactly the input string)",0x100 - sVar2);
  strlen(local_8);
  assert_int_eq((int)((ulong)in_stack_fffffffffffffd60 >> 0x20),(int)in_stack_fffffffffffffd60,
                (char *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),0);
  __n = 0x80;
  pcVar3 = (char *)operator_new__(0x80);
  memset(pcVar3,0x7f,__n);
  rtosc_print_arg_vals(scanned,(long)iVar1,pcVar3,__n,local_10,0);
  if (local_28 == (char *)0x0) {
    local_288 = local_8;
  }
  else {
    local_288 = local_28;
  }
  strcpy(local_138,"print \"");
  strncat(local_138,local_18,0xf8);
  __dest = local_138;
  sVar2 = strlen(local_138);
  strncat(__dest,"\" (value = value before scan)",0x100 - sVar2);
  assert_str_eq(in_stack_fffffffffffffd70,__dest,in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c
               );
  if (pcVar3 != (char *)0x0) {
    operator_delete__(pcVar3);
  }
  strcpy(local_138,"print \"");
  strncat(local_138,local_18,0xf8);
  pcVar3 = local_138;
  sVar2 = strlen(local_138);
  strncat(pcVar3,"\" (return value check)",0x100 - sVar2);
  strlen(local_288);
  assert_int_eq((int)((ulong)pcVar3 >> 0x20),(int)pcVar3,
                (char *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),0);
  return;
}

Assistant:

void check_alt(const char* arg_val_str, const rtosc_print_options* opt,
               const char* tc_base, int line,
               const char* _exp_print)
{
    const int tc_len = BUF_LEN;
    char tc_full[BUF_LEN]; // descr. for full testcase name
    int strbuflen = BUF_LEN;
    char strbuf[BUF_LEN];
    memset(strbuf, 0x7f, strbuflen); /* init with rubbish */

    int num = rtosc_count_printed_arg_vals(arg_val_str);
    assert(num < 32);
    // note: when using this, the next step is usually
    //       rtosc_arg_val_t scanned[num];
    //       in this case, however, we need the variable globally accessible
    size_t rd = rtosc_scan_arg_vals(arg_val_str, scanned, num,
                                    strbuf, strbuflen);

    strcpy(tc_full, "scan \"");
    strncat(tc_full, tc_base, tc_len-7);
    strncat(tc_full, "\" (read exactly the input string)",
            tc_len - strlen(tc_full));
    assert_int_eq(strlen(arg_val_str), rd, tc_full, line);

    size_t len = 128;
    char* printed = new char[len];
    memset(printed, 0x7f, len); /* init with rubbish */
    size_t written = rtosc_print_arg_vals(scanned, num, printed, len, opt, 0);

    const char* exp_print = _exp_print ? _exp_print : arg_val_str;
    strcpy(tc_full, "print \"");
    strncat(tc_full, tc_base, tc_len-8);
    strncat(tc_full, "\" (value = value before scan)",
            tc_len - strlen(tc_full));
    assert_str_eq(exp_print, printed, tc_full, line);
    delete[] printed;

    strcpy(tc_full, "print \"");
    strncat(tc_full, tc_base, tc_len-8);
    strncat(tc_full, "\" (return value check)", tc_len - strlen(tc_full));
    assert_int_eq(strlen(exp_print), written, tc_full, line);
}